

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O2

void __thiscall Imf_3_4::InputFile::Data::readPixels(Data *this,int scanLine1,int scanLine2)

{
  CompositeDeepScanLine *this_00;
  
  std::mutex::lock(&this->_mx);
  this_00 = (this->_compositor)._M_t.
            super___uniq_ptr_impl<Imf_3_4::CompositeDeepScanLine,_std::default_delete<Imf_3_4::CompositeDeepScanLine>_>
            ._M_t.
            super__Tuple_impl<0UL,_Imf_3_4::CompositeDeepScanLine_*,_std::default_delete<Imf_3_4::CompositeDeepScanLine>_>
            .super__Head_base<0UL,_Imf_3_4::CompositeDeepScanLine_*,_false>._M_head_impl;
  if (this_00 == (CompositeDeepScanLine *)0x0) {
    if (this->_storage == EXR_STORAGE_TILED) {
      bufferedReadPixels(this,scanLine1,scanLine2);
    }
    else {
      ScanLineInputFile::readPixels
                ((this->_sFile)._M_t.
                 super___uniq_ptr_impl<Imf_3_4::ScanLineInputFile,_std::default_delete<Imf_3_4::ScanLineInputFile>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Imf_3_4::ScanLineInputFile_*,_std::default_delete<Imf_3_4::ScanLineInputFile>_>
                 .super__Head_base<0UL,_Imf_3_4::ScanLineInputFile_*,_false>._M_head_impl,scanLine1,
                 scanLine2);
    }
  }
  else {
    CompositeDeepScanLine::readPixels(this_00,scanLine1,scanLine2);
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void
InputFile::Data::readPixels (int scanLine1, int scanLine2)
{
#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (_mx);
#endif

    if (_compositor) { _compositor->readPixels (scanLine1, scanLine2); }
    else if (_storage == EXR_STORAGE_TILED)
    {
        bufferedReadPixels (scanLine1, scanLine2);
    }
    else { _sFile->readPixels (scanLine1, scanLine2); }
}